

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

string * __thiscall
helics::CommonCore::getInjectionType_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  uchar uVar1;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
  *p_Var2;
  FederateState *pFVar3;
  InputInfo *this_00;
  string *psVar4;
  
  p_Var2 = getHandleInfo(this,handle);
  psVar4 = (string *)&gEmptyString_abi_cxx11_;
  if (p_Var2 != (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                 *)0x0) {
    uVar1 = (p_Var2->
            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
            ).
            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
            ._M_storage._M_storage.__data[4];
    if (uVar1 == 'e') {
      psVar4 = (string *)
               &(p_Var2->
                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                ).super__Hash_node_code_cache<true>;
    }
    else if (uVar1 == 'f') {
      psVar4 = (string *)p_Var2[2].super__Hash_node_base._M_nxt;
    }
    else if (uVar1 == 'i') {
      pFVar3 = getFederateAt(this,(LocalFederateId)
                                  *(BaseType *)
                                   &(p_Var2->
                                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
                                    ._M_storage._M_storage);
      this_00 = InterfaceInfo::getInput(&pFVar3->interfaceInformation,handle);
      if (this_00 != (InputInfo *)0x0) {
        psVar4 = InputInfo::getInjectionType_abi_cxx11_(this_00);
        return psVar4;
      }
    }
  }
  return psVar4;
}

Assistant:

const std::string& CommonCore::getInjectionType(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* inpInfo = fed->interfaces().getInput(handle);
                if (inpInfo != nullptr) {
                    return inpInfo->getInjectionType();
                }
                break;
            }
            case InterfaceType::ENDPOINT:
                return handleInfo->type;
            case InterfaceType::FILTER:
                return handleInfo->type_in;
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}